

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.c
# Opt level: O1

ZyanStatus
ZydisFormatterSetHook(ZydisFormatter *formatter,ZydisFormatterFunction type,void **callback)

{
  ZydisFormatterFunc p_Var1;
  ulong uVar2;
  int iVar3;
  ZyanStatus ZVar4;
  
  ZVar4 = 0x80100004;
  if (((type < (ZYDIS_FORMATTER_FUNC_MAX_VALUE|ZYDIS_FORMATTER_FUNC_POST_INSTRUCTION)) &&
      (formatter != (ZydisFormatter *)0x0)) && (callback != (void **)0x0)) {
    if (ZYDIS_FORMATTER_FUNC_MAX_VALUE < type) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                    ,0x1b5,
                    "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                   );
    }
    p_Var1 = (ZydisFormatterFunc)*callback;
    uVar2 = (ulong)type;
    iVar3 = type * 8;
    switch(uVar2) {
    case 1:
      if (iVar3 != 8) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_post_instruction",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x191,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case 2:
      if (iVar3 != 0x10) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_format_instruction",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x193,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case 3:
      if (iVar3 != 0x18) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_pre_operand",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x195,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case 4:
      if (iVar3 != 0x20) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_post_operand",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x197,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case 5:
      if (iVar3 != 0x28) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_format_operand_reg",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x199,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case 6:
      if (iVar3 != 0x30) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_format_operand_mem",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x19b,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case 7:
      if (iVar3 != 0x38) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_format_operand_ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x19d,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case 8:
      if (iVar3 != 0x40) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_format_operand_imm",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x19f,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case 9:
      if (iVar3 != 0x48) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_print_mnemonic",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x1a1,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case 10:
      if (iVar3 != 0x50) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_print_register",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x1a3,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case 0xb:
      if (iVar3 != 0x58) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_print_address_abs",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x1a5,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case 0xc:
      if (iVar3 != 0x60) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_print_address_rel",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x1a7,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case 0xd:
      if (iVar3 != 0x68) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_print_disp",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x1a9,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case 0xe:
      if (iVar3 != 0x70) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_print_imm",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x1ab,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case 0xf:
      if (iVar3 != 0x78) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_print_typecast",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x1ad,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case 0x10:
      if (iVar3 != 0x80) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_print_segment",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x1af,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case 0x11:
      if (iVar3 != 0x88) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_print_prefixes",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x1b1,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
      break;
    case 0x12:
      if (iVar3 != 0x90) {
        __assert_fail("test == (ZyanUPointer*)&formatter->func_print_decorator",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Formatter.c"
                      ,0x1b3,
                      "ZyanStatus ZydisFormatterSetHook(ZydisFormatter *, ZydisFormatterFunction, const void **)"
                     );
      }
    }
    *callback = (&formatter->func_pre_instruction)[uVar2];
    ZVar4 = 0x100000;
    if (p_Var1 != (ZydisFormatterFunc)0x0) {
      (&formatter->func_pre_instruction)[uVar2] = p_Var1;
    }
  }
  return ZVar4;
}

Assistant:

ZyanStatus ZydisFormatterSetHook(ZydisFormatter* formatter, ZydisFormatterFunction type,
    const void** callback)
{
    if (!formatter || !callback || ((ZyanUSize)type > ZYDIS_FORMATTER_FUNC_MAX_VALUE))
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    const void* const temp = *callback;

    // The following code relies on the order of the enum values and the function fields inside
    // the `ZydisFormatter` struct

#ifdef ZYAN_DEBUG
    const ZyanUPointer* test = (ZyanUPointer*)(&formatter->func_pre_instruction + type);
    switch (type)
    {
    case ZYDIS_FORMATTER_FUNC_PRE_INSTRUCTION:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_pre_instruction   ); break;
    case ZYDIS_FORMATTER_FUNC_POST_INSTRUCTION:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_post_instruction  ); break;
    case ZYDIS_FORMATTER_FUNC_FORMAT_INSTRUCTION:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_format_instruction); break;
    case ZYDIS_FORMATTER_FUNC_PRE_OPERAND:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_pre_operand       ); break;
    case ZYDIS_FORMATTER_FUNC_POST_OPERAND:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_post_operand      ); break;
    case ZYDIS_FORMATTER_FUNC_FORMAT_OPERAND_REG:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_format_operand_reg); break;
    case ZYDIS_FORMATTER_FUNC_FORMAT_OPERAND_MEM:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_format_operand_mem); break;
    case ZYDIS_FORMATTER_FUNC_FORMAT_OPERAND_PTR:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_format_operand_ptr); break;
    case ZYDIS_FORMATTER_FUNC_FORMAT_OPERAND_IMM:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_format_operand_imm); break;
    case ZYDIS_FORMATTER_FUNC_PRINT_MNEMONIC:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_print_mnemonic    ); break;
    case ZYDIS_FORMATTER_FUNC_PRINT_REGISTER:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_print_register    ); break;
    case ZYDIS_FORMATTER_FUNC_PRINT_ADDRESS_ABS:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_print_address_abs ); break;
    case ZYDIS_FORMATTER_FUNC_PRINT_ADDRESS_REL:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_print_address_rel ); break;
    case ZYDIS_FORMATTER_FUNC_PRINT_DISP:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_print_disp        ); break;
    case ZYDIS_FORMATTER_FUNC_PRINT_IMM:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_print_imm         ); break;
    case ZYDIS_FORMATTER_FUNC_PRINT_TYPECAST:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_print_typecast    ); break;
    case ZYDIS_FORMATTER_FUNC_PRINT_SEGMENT:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_print_segment     ); break;
    case ZYDIS_FORMATTER_FUNC_PRINT_PREFIXES:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_print_prefixes    ); break;
    case ZYDIS_FORMATTER_FUNC_PRINT_DECORATOR:
        ZYAN_ASSERT(test == (ZyanUPointer*)&formatter->func_print_decorator   ); break;
    default:
        ZYAN_UNREACHABLE;
    }
#endif

    *callback = *(const void**)(&formatter->func_pre_instruction + type);
    if (!temp)
    {
        return ZYAN_STATUS_SUCCESS;
    }
    ZYAN_MEMCPY(&formatter->func_pre_instruction + type, &temp, sizeof(ZyanUPointer));

    return ZYAN_STATUS_SUCCESS;
}